

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O1

uint __thiscall ConvexBuilder::process(ConvexBuilder *this,DecompDesc *desc)

{
  float fVar1;
  ChUll *this_00;
  ChUll **ptr;
  bool bVar2;
  HullError HVar3;
  long lVar4;
  uint uVar5;
  HullLibrary hl;
  HullResult result;
  HullDesc hdesc;
  ConvexResult r;
  HullLibrary local_129;
  HullResult local_128;
  HullDesc local_108;
  ConvexResult local_d8;
  
  MAXDEPTH = *(uint *)(desc + 0x20);
  CONCAVE_PERCENT = *(float *)(desc + 0x24);
  MERGE_PERCENT = *(float *)(desc + 0x28);
  ConvexDecomposition::calcConvexDecomposition
            (*(uint *)desc,*(float **)(desc + 8),*(uint *)(desc + 0x10),*(uint **)(desc + 0x18),
             &this->super_ConvexDecompInterface,0.0,0);
  do {
    bVar2 = combineHulls(this);
  } while (bVar2);
  uVar5 = (this->mChulls).m_size;
  if (0 < (int)uVar5) {
    lVar4 = 0;
    do {
      this_00 = (ChUll *)(this->mChulls).m_data[lVar4];
      local_128.mPolygons = true;
      local_128.mNumIndices = 0;
      local_128.mIndices = (uint *)0x0;
      local_128.mNumOutputVertices = 0;
      local_128.mOutputVertices._0_4_ = 0;
      local_128.mOutputVertices._4_4_ = 0;
      local_128.mNumFaces = 0;
      local_108.mMaxFaces = 0x1000;
      local_108.mFlags = 1;
      local_108.mVertices = *(float **)(*(uint **)&this_00->mDiagonal + 2);
      local_108.mVertexStride = 0xc;
      local_108.mNormalEpsilon = 0.001;
      local_108.mSkinWidth = 0.01;
      fVar1 = *(float *)(desc + 0x30);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_108.mFlags = 5;
        local_108.mSkinWidth = fVar1;
      }
      local_108.mMaxVertices = *(uint *)(desc + 0x2c);
      local_108.mVcount = **(uint **)&this_00->mDiagonal;
      HVar3 = ConvexDecomposition::HullLibrary::CreateConvexHull(&local_129,&local_108,&local_128);
      if (HVar3 == QE_OK) {
        ConvexDecomposition::ConvexResult::ConvexResult
                  (&local_d8,local_128.mNumOutputVertices,
                   (float *)CONCAT44(local_128.mOutputVertices._4_4_,local_128.mOutputVertices._0_4_
                                    ),local_128.mNumFaces,local_128.mIndices);
        local_d8.mHullVolume =
             computeMeshVolume((float *)CONCAT44(local_128.mOutputVertices._4_4_,
                                                 local_128.mOutputVertices._0_4_),
                               local_128.mNumFaces,local_128.mIndices);
        computeBestFitOBB(local_128.mNumOutputVertices,
                          (float *)CONCAT44(local_128.mOutputVertices._4_4_,
                                            local_128.mOutputVertices._0_4_),0xc,local_d8.mOBBSides,
                          local_d8.mOBBTransform);
        local_d8.mOBBVolume = local_d8.mOBBSides[0] * local_d8.mOBBSides[1] * local_d8.mOBBSides[2];
        fm_getTranslation(local_d8.mOBBTransform,local_d8.mOBBCenter);
        fm_matrixToQuat(local_d8.mOBBTransform,local_d8.mOBBOrientation);
        local_d8.mSphereRadius =
             computeBoundingSphere
                       (local_128.mNumOutputVertices,
                        (float *)CONCAT44(local_128.mOutputVertices._4_4_,
                                          local_128.mOutputVertices._0_4_),local_d8.mSphereCenter);
        local_d8.mSphereVolume = fm_sphereVolume(local_d8.mSphereRadius);
        (*this->mCallback->_vptr_ConvexDecompInterface[6])(this->mCallback,&local_d8);
        ConvexDecomposition::ConvexResult::~ConvexResult(&local_d8);
      }
      ConvexDecomposition::HullLibrary::ReleaseResult(&local_129,&local_128);
      if (this_00 != (ChUll *)0x0) {
        ChUll::~ChUll(this_00);
        operator_delete(this_00,0x28);
      }
      lVar4 = lVar4 + 1;
      uVar5 = (this->mChulls).m_size;
    } while (lVar4 < (int)uVar5);
  }
  ptr = (this->mChulls).m_data;
  if (ptr != (ChUll **)0x0) {
    if ((this->mChulls).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->mChulls).m_data = (ChUll **)0x0;
  }
  (this->mChulls).m_ownsMemory = true;
  (this->mChulls).m_data = (ChUll **)0x0;
  (this->mChulls).m_size = 0;
  (this->mChulls).m_capacity = 0;
  return uVar5;
}

Assistant:

unsigned int ConvexBuilder::process(const DecompDesc &desc)
{

	unsigned int ret = 0;

	MAXDEPTH        = desc.mDepth;
	CONCAVE_PERCENT = desc.mCpercent;
	MERGE_PERCENT   = desc.mPpercent;


	calcConvexDecomposition(desc.mVcount, desc.mVertices, desc.mTcount, desc.mIndices,this,0,0);


	while ( combineHulls() ); // keep combining hulls until I can't combine any more...

	int i;
	for (i=0;i<mChulls.size();i++)
	{
		ChUll *cr = mChulls[i];

		// before we hand it back to the application, we need to regenerate the hull based on the
		// limits given by the user.

		const ConvexResult &c = *cr->mResult; // the high resolution hull...

		HullResult result;
		HullLibrary hl;
		HullDesc   hdesc;

		hdesc.SetHullFlag(QF_TRIANGLES);

		hdesc.mVcount       = c.mHullVcount;
		hdesc.mVertices     = c.mHullVertices;
		hdesc.mVertexStride = sizeof(float)*3;
		hdesc.mMaxVertices  = desc.mMaxVertices; // maximum number of vertices allowed in the output

		if ( desc.mSkinWidth  )
		{
			hdesc.mSkinWidth = desc.mSkinWidth;
			hdesc.SetHullFlag(QF_SKIN_WIDTH); // do skin width computation.
		}

		HullError ret = hl.CreateConvexHull(hdesc,result);

		if ( ret == QE_OK )
		{
			ConvexResult r(result.mNumOutputVertices, result.mOutputVertices, result.mNumFaces, result.mIndices);

			r.mHullVolume = computeMeshVolume( result.mOutputVertices, result.mNumFaces, result.mIndices ); // the volume of the hull.

			// compute the best fit OBB
			computeBestFitOBB( result.mNumOutputVertices, result.mOutputVertices, sizeof(float)*3, r.mOBBSides, r.mOBBTransform );

			r.mOBBVolume = r.mOBBSides[0] * r.mOBBSides[1] *r.mOBBSides[2]; // compute the OBB volume.

			fm_getTranslation( r.mOBBTransform, r.mOBBCenter );      // get the translation component of the 4x4 matrix.

			fm_matrixToQuat( r.mOBBTransform, r.mOBBOrientation );   // extract the orientation as a quaternion.

			r.mSphereRadius = computeBoundingSphere( result.mNumOutputVertices, result.mOutputVertices, r.mSphereCenter );
			r.mSphereVolume = fm_sphereVolume( r.mSphereRadius );


			mCallback->ConvexDecompResult(r);
		}

		hl.ReleaseResult (result);


		delete cr;
	}

	ret = mChulls.size();

	mChulls.clear();

	return ret;
}